

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O2

void gdImageSharpen(gdImagePtr im,int pct)

{
  float outer_coeff;
  int iVar1;
  int iVar2;
  int c;
  int nc;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  float inner_coeff;
  
  if ((0 < pct) && (im->trueColor != 0)) {
    iVar3 = im->sx;
    outer_coeff = (float)-pct / 400.0;
    iVar4 = im->sy;
    inner_coeff = 1.0 - (outer_coeff + outer_coeff);
    iVar1 = iVar4 + -1;
    iVar8 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    iVar7 = 0;
    if (0 < iVar3) {
      iVar7 = iVar3;
    }
    for (; iVar8 != iVar7; iVar8 = iVar8 + 1) {
      iVar2 = gdImageGetPixel(im,iVar8,0);
      iVar6 = iVar1;
      iVar5 = 0;
      while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
        c = gdImageGetPixel(im,iVar8,iVar5);
        nc = gdImageGetTrueColorPixel(im,iVar8,iVar5 + 1);
        iVar2 = gdImageSubSharpen(iVar2,c,nc,inner_coeff,outer_coeff);
        gdImageSetPixel(im,iVar8,iVar5,iVar2);
        iVar2 = c;
        iVar5 = iVar5 + 1;
      }
      iVar6 = gdImageGetPixel(im,iVar8,iVar1);
      iVar2 = gdImageSubSharpen(iVar2,iVar6,iVar6,inner_coeff,outer_coeff);
      gdImageSetPixel(im,iVar8,iVar1,iVar2);
    }
    iVar3 = iVar3 + -1;
    iVar1 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if (iVar4 < 1) {
      iVar4 = iVar1;
    }
    for (; iVar1 != iVar4; iVar1 = iVar1 + 1) {
      iVar8 = gdImageGetPixel(im,0,iVar1);
      iVar7 = iVar3;
      iVar2 = 0;
      while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
        iVar6 = gdImageGetPixel(im,iVar2,iVar1);
        iVar5 = gdImageGetTrueColorPixel(im,iVar2 + 1,iVar1);
        iVar8 = gdImageSubSharpen(iVar8,iVar6,iVar5,inner_coeff,outer_coeff);
        gdImageSetPixel(im,iVar2,iVar1,iVar8);
        iVar8 = iVar6;
        iVar2 = iVar2 + 1;
      }
      iVar7 = gdImageGetPixel(im,iVar3,iVar1);
      iVar8 = gdImageSubSharpen(iVar8,iVar7,iVar7,inner_coeff,outer_coeff);
      gdImageSetPixel(im,iVar3,iVar1,iVar8);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void)
gdImageSharpen (gdImagePtr im, int pct)
{
	int x, y;
	int sx, sy;
	float inner_coeff, outer_coeff;

	sx = im->sx;
	sy = im->sy;

	/* Must sum to 1 to avoid overall change in brightness.
	 * Scaling chosen so that pct=100 gives 1-D filter [-1 6 -1]/4,
	 * resulting in a 2-D filter [1 -6 1; -6 36 -6; 1 -6 1]/16,
	 * which gives noticeable, but not excessive, sharpening
	 */

	outer_coeff = -pct / 400.0;
	inner_coeff = 1 - 2 * outer_coeff;

	/* Don't try to do anything with non-truecolor images, as
	   pointless,
	   * nor for pct<=0, as small kernel size leads to nasty
	   artefacts when blurring
	 */
	if ((im->trueColor) && (pct > 0)) {

		/* First pass, 1-D convolution column-wise */
		for (x = 0; x < sx; x++) {

			/* pc is colour of previous pixel; c of the
			   current pixel and nc of the next */
			int pc, c, nc;

			/* Replicate edge pixel at image boundary */
			pc = gdImageGetPixel (im, x, 0);

			/* Stop looping before last pixel to avoid
			   conditional within loop */
			for (y = 0; y < sy - 1; y++) {

				c = gdImageGetPixel (im, x, y);

				nc = gdImageGetTrueColorPixel (im, x, y + 1);

				/* Update centre pixel to new colour */
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));

				/* Save original colour of current
				   pixel for next time round */
				pc = c;
			}

			/* Deal with last pixel, replicating current
			   pixel at image boundary */
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}

		/* Second pass, 1-D convolution row-wise */
		for (y = 0; y < sy; y++) {
			int pc, c;
			pc = gdImageGetPixel (im, 0, y);
			for (x = 0; x < sx - 1; x++) {
				int c, nc;
				c = gdImageGetPixel (im, x, y);
				nc = gdImageGetTrueColorPixel (im, x + 1, y);
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));
				pc = c;
			}
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}
	}
}